

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splitting_filter.cc
# Opt level: O3

void __thiscall
webrtc::SplittingFilter::Synthesis
          (SplittingFilter *this,IFChannelBuffer *bands,IFChannelBuffer *data)

{
  string *result;
  size_t sVar1;
  int line;
  size_t local_198;
  FatalMessage local_190;
  
  local_190._0_8_ = (bands->ibuf_).num_bands_;
  if (this->num_bands_ != local_190._0_8_) {
    result = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                       (&this->num_bands_,(unsigned_long *)&local_190,
                        "num_bands_ == bands->num_bands()");
    if (result != (string *)0x0) {
      line = 0x31;
      goto LAB_001852ff;
    }
  }
  local_190._0_8_ = (data->ibuf_).num_channels_;
  local_198 = (bands->ibuf_).num_channels_;
  if (local_190._0_8_ != local_198) {
    result = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                       ((unsigned_long *)&local_190,&local_198,
                        "data->num_channels() == bands->num_channels()");
    if (result != (string *)0x0) {
      line = 0x32;
      goto LAB_001852ff;
    }
  }
  local_190._0_8_ = (data->ibuf_).num_frames_;
  sVar1 = (bands->ibuf_).num_bands_;
  local_198 = (bands->ibuf_).num_frames_per_band_ * sVar1;
  if (local_190._0_8_ != local_198) {
    result = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                       ((unsigned_long *)&local_190,&local_198,
                        "data->num_frames() == bands->num_frames_per_band() * bands->num_bands()");
    if (result != (string *)0x0) {
      line = 0x34;
LAB_001852ff:
      rtc::FatalMessage::FatalMessage
                (&local_190,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/splitting_filter.cc"
                 ,line,result);
      rtc::FatalMessage::~FatalMessage(&local_190);
    }
    sVar1 = (bands->ibuf_).num_bands_;
  }
  if (sVar1 == 3) {
    ThreeBandsSynthesis(this,bands,data);
  }
  else if (sVar1 == 2) {
    TwoBandsSynthesis(this,bands,data);
  }
  return;
}

Assistant:

void SplittingFilter::Synthesis(const IFChannelBuffer* bands,
                                IFChannelBuffer* data) {
  RTC_DCHECK_EQ(num_bands_, bands->num_bands());
  RTC_DCHECK_EQ(data->num_channels(), bands->num_channels());
  RTC_DCHECK_EQ(data->num_frames(),
                bands->num_frames_per_band() * bands->num_bands());
  if (bands->num_bands() == 2) {
    TwoBandsSynthesis(bands, data);
  } else if (bands->num_bands() == 3) {
    ThreeBandsSynthesis(bands, data);
  }
}